

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QByteArray * __thiscall QWidget::saveGeometry(QByteArray *__return_storage_ptr__,QWidget *this)

{
  long *plVar1;
  QScreen *pQVar2;
  QDataStream *pQVar3;
  int extraout_EDX;
  int iVar4;
  long lVar5;
  long in_FS_OFFSET;
  QRect local_80;
  QRect local_70;
  long local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,__return_storage_ptr__,2);
  uStack_40 = 7;
  QGuiApplication::screens();
  pQVar2 = screen(this);
  if (local_60 == 0) {
LAB_0030752b:
    iVar4 = -1;
  }
  else {
    iVar4 = -1;
    lVar5 = 0;
    do {
      if (local_60 << 3 == lVar5) goto LAB_0030752b;
      iVar4 = iVar4 + 1;
      plVar1 = (long *)(local_70._8_8_ + lVar5);
      lVar5 = lVar5 + 8;
    } while ((QScreen *)*plVar1 != pQVar2);
  }
  if ((QArrayData *)local_70._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_70._0_8_,8,0x10);
    }
  }
  pQVar3 = (QDataStream *)QDataStream::operator<<((QDataStream *)&local_58,0x1d9d0cb);
  pQVar3 = (QDataStream *)QDataStream::operator<<(pQVar3,3);
  pQVar3 = (QDataStream *)QDataStream::operator<<(pQVar3,0);
  local_70 = frameGeometry(this);
  pQVar3 = (QDataStream *)::operator<<(pQVar3,&local_70);
  local_80 = normalGeometry(this);
  pQVar3 = (QDataStream *)::operator<<(pQVar3,&local_80);
  pQVar3 = (QDataStream *)QDataStream::operator<<(pQVar3,iVar4);
  pQVar3 = (QDataStream *)QDataStream::operator<<(pQVar3,*(uint *)&this->data->field_0x10 & 2);
  pQVar3 = (QDataStream *)QDataStream::operator<<(pQVar3,*(uint *)&this->data->field_0x10 & 4);
  screen(this);
  iVar4 = QScreen::geometry();
  pQVar3 = (QDataStream *)QDataStream::operator<<(pQVar3,(extraout_EDX - iVar4) + 1);
  ::operator<<(pQVar3,&this->data->crect);
  QDataStream::~QDataStream((QDataStream *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QWidget::saveGeometry() const
{
    QByteArray array;
    QDataStream stream(&array, QIODevice::WriteOnly);
    stream.setVersion(QDataStream::Qt_4_0);
    const quint32 magicNumber = 0x1D9D0CB;
    // Version history:
    // - Qt 4.2 - 4.8.6, 5.0 - 5.3    : Version 1.0
    // - Qt 4.8.6 - today, 5.4 - today: Version 2.0, save screen width in addition to check for high DPI scaling.
    // - Qt 5.12 - today              : Version 3.0, save QWidget::geometry()
    quint16 majorVersion = 3;
    quint16 minorVersion = 0;
    const int screenNumber = QGuiApplication::screens().indexOf(screen());
    stream << magicNumber
           << majorVersion
           << minorVersion
           << frameGeometry()
           << normalGeometry()
           << qint32(screenNumber)
           << quint8(windowState() & Qt::WindowMaximized)
           << quint8(windowState() & Qt::WindowFullScreen)
           << qint32(screen()->geometry().width()) // added in 2.0
           << geometry(); // added in 3.0
    return array;
}